

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

int m_split_output(aec_stream_conflict *strm)

{
  int iVar1;
  int iVar2;
  internal_state_conflict *piVar3;
  byte *pbVar4;
  uint32_t *puVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  
  piVar3 = strm->state;
  iVar2 = piVar3->id;
  iVar6 = piVar3->bitp;
  iVar1 = iVar2 + -1;
  while( true ) {
    if (iVar6 < iVar1) {
      sVar8 = strm->avail_in;
      do {
        sVar8 = sVar8 - 1;
        if (sVar8 == 0xffffffffffffffff) {
          return 0;
        }
        strm->avail_in = sVar8;
        uVar10 = piVar3->acc << 8;
        piVar3->acc = uVar10;
        pbVar4 = strm->next_in;
        strm->next_in = pbVar4 + 1;
        piVar3->acc = *pbVar4 | uVar10;
        iVar6 = iVar6 + 8;
        piVar3->bitp = iVar6;
      } while (iVar6 < iVar1);
    }
    uVar10 = strm->avail_out;
    uVar9 = (ulong)piVar3->bytes_per_sample;
    if (uVar10 < uVar9) break;
    if (iVar1 == 0) {
      piVar3->rsip = piVar3->rsip + 1;
    }
    else {
      puVar5 = piVar3->rsip;
      piVar3->rsip = puVar5 + 1;
      *puVar5 = *puVar5 + ((uint)(piVar3->acc >> ((char)iVar6 - (char)iVar1 & 0x3fU)) &
                          (uint)(0xffffffffffffffff >> (0x41U - (char)iVar2 & 0x3f)));
      uVar9 = (ulong)piVar3->bytes_per_sample;
      iVar6 = piVar3->bitp - iVar1;
      piVar3->bitp = iVar6;
    }
    strm->avail_out = uVar10 - uVar9;
    uVar7 = piVar3->sample_counter + 1;
    piVar3->sample_counter = uVar7;
    if (piVar3->encoded_block_size <= uVar7) {
      piVar3->mode = m_next_cds;
      return 1;
    }
  }
  return 0;
}

Assistant:

static int m_split_output(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;
    int k = state->id - 1;

    do {
        if (bits_ask(strm, k) == 0 || strm->avail_out < state->bytes_per_sample)
            return M_EXIT;
        if (k)
            *state->rsip++ += bits_get(strm, k);
        else
            state->rsip++;
        strm->avail_out -= state->bytes_per_sample;
        bits_drop(strm, k);
    } while(++state->sample_counter < state->encoded_block_size);

    state->mode = m_next_cds;
    return M_CONTINUE;
}